

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  char cVar1;
  int iVar2;
  int angle;
  string imgPath;
  Mat img;
  Mat rotated;
  int local_19c;
  long *local_198 [2];
  long local_188 [2];
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  _InputArray local_158;
  Mat local_140;
  Mat local_e0;
  Mat local_80;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Image File Path : ",0x18);
  local_170 = 0;
  local_168 = 0;
  local_178 = &local_168;
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '(');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_178,cVar1);
  cv::imread((string *)&local_140,(int)&local_178);
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter Angle : ",0xe);
    std::istream::operator>>((istream *)&std::cin,&local_19c);
    local_19c = local_19c % 0x168;
    cv::Mat::Mat(&local_e0,&local_140);
    rotate(&local_80,&local_e0,local_19c);
    cv::Mat::~Mat(&local_e0);
    cVar1 = cv::Mat::empty();
    if (cVar1 == '\0') {
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Original","");
      local_158.sz.width = 0;
      local_158.sz.height = 0;
      local_158.flags = 0x1010000;
      local_158.obj = &local_140;
      cv::imshow((string *)local_198,&local_158);
      if (local_198[0] != local_188) {
        operator_delete(local_198[0],local_188[0] + 1);
      }
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Rotated","");
      local_158.sz.width = 0;
      local_158.sz.height = 0;
      local_158.flags = 0x1010000;
      local_158.obj = &local_80;
      cv::imshow((string *)local_198,&local_158);
      if (local_198[0] != local_188) {
        operator_delete(local_198[0],local_188[0] + 1);
      }
      iVar2 = 0;
      cv::waitKey(0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR Rotating Image.",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      iVar2 = -1;
      std::ostream::flush();
    }
    cv::Mat::~Mat(&local_80);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR Loading Image File.",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    iVar2 = -1;
    std::ostream::flush();
  }
  cv::Mat::~Mat(&local_140);
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  return iVar2;
}

Assistant:

int main() {
    cout<<"Enter Image File Path : ";
    string imgPath;
    getline(cin,imgPath);
    Mat img = imread(imgPath,IMREAD_UNCHANGED);
    if(img.empty()){
        cout<<"ERROR Loading Image File."<<endl;
        return -1;
    }
    cout<<"Enter Angle : ";
    int angle;
    cin>>angle;
    angle = angle%360;
    Mat rotated = rotate(img,angle);
    if(rotated.empty()){
        cout<<"ERROR Rotating Image."<<endl;
        return -1;
    }
    imshow("Original", img);
    imshow("Rotated", rotated);
    waitKey(0);
    return 0;
}